

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

void __thiscall QIconTheme::QIconTheme(QIconTheme *this,QString *themeName)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  bool bVar4;
  Context CVar5;
  short sVar6;
  int iVar7;
  QDebug *pQVar8;
  long lVar9;
  Type TVar10;
  undefined1 *puVar11;
  QString *key;
  QString *pQVar12;
  long in_FS_OFFSET;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView local_1e8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_1d8 [2];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_1c8 [2];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_1b8 [2];
  QArrayDataPointer<char16_t> local_1a8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_188 [2];
  QArrayDataPointer<char16_t> local_178;
  QAnyStringView local_158;
  QArrayDataPointer<char16_t> local_148;
  QDir iconDir;
  undefined1 *local_108;
  undefined1 *puStack_100;
  QFileInfo themeDirInfo;
  QString *pQStack_f0;
  char *local_e8;
  QArrayDataPointer<QString> local_d8;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 local_a8 [32];
  QStringBuilder<QString,_char16_t> local_88;
  QIconDirInfo dirInfo;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_gtkCaches).d.d = (Data *)0x0;
  (this->m_gtkCaches).d.ptr = (QSharedPointer<QIconCacheGtkReader> *)0x0;
  (this->m_gtkCaches).d.size = 0;
  (this->m_contentDirs).d.d = (Data *)0x0;
  (this->m_contentDirs).d.ptr = (QString *)0x0;
  (this->m_contentDirs).d.size = 0;
  (this->m_keyList).d.d = (Data *)0x0;
  (this->m_keyList).d.ptr = (QIconDirInfo *)0x0;
  (this->m_keyList).d.size = 0;
  (this->m_parents).d.d = (Data *)0x0;
  (this->m_parents).d.ptr = (QString *)0x0;
  *(undefined8 *)((long)&(this->m_parents).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this->m_parents).d.size + 1) = 0;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_b8);
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::themeSearchPaths();
  lVar9 = 0;
  for (puVar11 = (undefined1 *)0x0; pcVar2 = local_e8, pQVar12 = pQStack_f0,
      puVar11 < (ulong)local_d8.size; puVar11 = puVar11 + 1) {
    _iconDir = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QDir::QDir(&iconDir,(QString *)((long)&((local_d8.ptr)->d).d + lVar9));
    local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDir::path();
    local_88.a.d.d = (Data *)_themeDirInfo;
    _themeDirInfo = (QArrayDataPointer<char16_t> *)0x0;
    pQStack_f0 = (QString *)0x0;
    local_e8 = (char *)0x0;
    local_88.a.d.ptr = (char16_t *)pQVar12;
    local_88.a.d.size = (qsizetype)pcVar2;
    local_88.b = L'/';
    QStringBuilder<QString,_char16_t>::QStringBuilder
              ((QStringBuilder<QString,_char16_t> *)&dirInfo,&local_88);
    dirInfo._32_8_ = themeName;
    QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&>::convertTo<QString>
              ((QString *)local_a8,
               (QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&> *)&dirInfo);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dirInfo);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&themeDirInfo);
    _themeDirInfo = (QArrayDataPointer<char16_t> *)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&themeDirInfo,(QString *)local_a8);
    cVar3 = QFileInfo::isDir();
    if (cVar3 != '\0') {
      QList<QString>::emplaceBack<QString_const&>(&this->m_contentDirs,(QString *)local_a8);
      QSharedPointer<QIconCacheGtkReader>::create<QString&>
                ((QSharedPointer<QIconCacheGtkReader> *)&dirInfo,(QString *)local_a8);
      QList<QSharedPointer<QIconCacheGtkReader>>::emplaceBack<QSharedPointer<QIconCacheGtkReader>>
                ((QList<QSharedPointer<QIconCacheGtkReader>> *)&this->m_gtkCaches,
                 (QSharedPointer<QIconCacheGtkReader> *)&dirInfo);
      QSharedPointer<QIconCacheGtkReader>::deref
                ((Data *)CONCAT44(dirInfo.path.d.ptr._4_4_,dirInfo.path.d.ptr._0_4_));
    }
    if (this->m_valid == false) {
      local_88.a.d.ptr = (char16_t *)&DAT_0000000c;
      local_88.a.d.size = 0x5c49b8;
      local_88.a.d.d = (Data *)local_a8;
      QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                (&dirInfo.path,(QStringBuilder<QString_&,_QLatin1String> *)&local_88);
      QFile::setFileName((QString *)&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dirInfo);
      bVar4 = (bool)QFile::exists();
      this->m_valid = bVar4;
      lcIconLoader();
      if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        dirInfo.path.d.d._0_4_ = 2;
        dirInfo.path.d.d._4_4_ = 0;
        dirInfo.path.d.ptr._0_4_ = 0;
        dirInfo.path.d.ptr._4_4_ = 0;
        dirInfo.path.d.size._0_4_ = 0;
        dirInfo.path.d.size._4_4_ = 0;
        dirInfo._24_8_ = lcIconLoader::category.name;
        QMessageLogger::debug();
        pQVar8 = QDebug::operator<<((QDebug *)&local_148,"Probing theme file at");
        QFile::fileName();
        pQVar8 = QDebug::operator<<(pQVar8,&local_88.a);
        QDebug::operator<<(pQVar8,this->m_valid);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
        QDebug::~QDebug((QDebug *)&local_148);
      }
    }
    QFileInfo::~QFileInfo(&themeDirInfo);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
    QDir::~QDir(&iconDir);
    lVar9 = lVar9 + 0x18;
  }
  if (this->m_valid != false) {
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
    QFile::fileName();
    QSettings::QSettings((QSettings *)&local_108,(QString *)&dirInfo,IniFormat,(QObject *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dirInfo);
    _themeDirInfo = (QArrayDataPointer<char16_t> *)&DAT_aaaaaaaaaaaaaaaa;
    QSettings::allKeys();
    pQVar12 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    for (lVar9 = -0x10; lVar9 != 0; lVar9 = lVar9 + -0x18) {
      cVar3 = QString::endsWith((QLatin1String *)pQVar12,5);
      if (cVar3 != '\0') {
        QVar13.m_size = (size_t)&local_108;
        QVar13.field_0.m_data_utf8 = (char *)&dirInfo;
        QSettings::value(QVar13);
        iVar7 = ::QVariant::toInt((bool *)&dirInfo);
        ::QVariant::~QVariant((QVariant *)&dirInfo);
        if (iVar7 != 0) {
          _iconDir = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QString::left((QString *)&iconDir,pQVar12,(pQVar12->d).size + -5);
          dirInfo._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          dirInfo.path.d.size._0_4_ = 0xaaaaaaaa;
          dirInfo.path.d.size._4_4_ = 0xaaaaaaaa;
          dirInfo._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          dirInfo.path.d.d._0_4_ = 0xaaaaaaaa;
          dirInfo.path.d.d._4_4_ = 0xaaaaaaaa;
          dirInfo.path.d.ptr._0_4_ = 0xaaaaaaaa;
          dirInfo.path.d.ptr._4_4_ = 0xaaaaaaaa;
          QIconDirInfo::QIconDirInfo(&dirInfo,(QString *)&iconDir);
          dirInfo.size = (short)iVar7;
          local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_148.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_a8._8_8_ = (char16_t *)0x5;
          local_a8._16_8_ = "/Type";
          local_178.d = (Data *)0x0;
          local_178.ptr = (char16_t *)0x0;
          local_178.size = 0;
          local_a8._0_8_ = &iconDir;
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    (&local_158,(QStringBuilder<QString_&,_QLatin1String> *)local_a8,
                     (wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> *)&local_178);
          QVar14.m_size = (size_t)&local_108;
          QVar14.field_0.m_data_utf8 = (char *)&local_88;
          QSettings::value(QVar14);
          ::QVariant::toString();
          ::QVariant::~QVariant((QVariant *)&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
          local_88.a.d.d = (Data *)0x5;
          local_88.a.d.ptr = L"Fixed";
          bVar4 = ::operator==((QString *)&local_148,(QLatin1StringView *)&local_88);
          if (bVar4) {
            TVar10 = Fixed;
          }
          else {
            local_88.a.d.d = (Data *)&DAT_00000008;
            local_88.a.d.ptr = L"Scalable";
            bVar4 = ::operator==((QString *)&local_148,(QLatin1StringView *)&local_88);
            TVar10 = Threshold - bVar4;
          }
          dirInfo.type = TVar10;
          local_178.d = (Data *)&iconDir;
          local_178.ptr = (char16_t *)0xa;
          local_178.size = 0x5c49f6;
          local_1a8.d = (Data *)0x0;
          local_1a8.ptr = (char16_t *)0x0;
          local_1a8.size = 0;
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    ((QAnyStringView *)local_188,
                     (QStringBuilder<QString_&,_QLatin1String> *)&local_178,
                     (wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> *)&local_1a8);
          ::QVariant::QVariant((QVariant *)local_a8,2);
          QVar15.m_size = (size_t)&local_108;
          QVar15.field_0.m_data_utf8 = (char *)&local_88;
          QSettings::value(QVar15,(QVariant *)local_188[0].m_data);
          sVar6 = ::QVariant::toInt((bool *)&local_88);
          dirInfo.threshold = sVar6;
          ::QVariant::~QVariant((QVariant *)&local_88);
          ::QVariant::~QVariant((QVariant *)local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
          local_178.d = (Data *)&iconDir;
          local_178.ptr = (char16_t *)&DAT_00000008;
          local_178.size = 0x5c4a01;
          local_1a8.d = (Data *)0x0;
          local_1a8.ptr = (char16_t *)0x0;
          local_1a8.size = 0;
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    ((QAnyStringView *)local_1b8,
                     (QStringBuilder<QString_&,_QLatin1String> *)&local_178,
                     (wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> *)&local_1a8);
          ::QVariant::QVariant((QVariant *)local_a8,iVar7);
          QVar16.m_size = (size_t)&local_108;
          QVar16.field_0.m_data_utf8 = (char *)&local_88;
          QSettings::value(QVar16,(QVariant *)local_1b8[0].m_data);
          sVar6 = ::QVariant::toInt((bool *)&local_88);
          dirInfo.minSize = sVar6;
          ::QVariant::~QVariant((QVariant *)&local_88);
          ::QVariant::~QVariant((QVariant *)local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
          local_178.d = (Data *)&iconDir;
          local_178.ptr = (char16_t *)&DAT_00000008;
          local_178.size = 0x5c4a0a;
          local_1a8.d = (Data *)0x0;
          local_1a8.ptr = (char16_t *)0x0;
          local_1a8.size = 0;
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    ((QAnyStringView *)local_1c8,
                     (QStringBuilder<QString_&,_QLatin1String> *)&local_178,
                     (wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> *)&local_1a8);
          ::QVariant::QVariant((QVariant *)local_a8,iVar7);
          QVar17.m_size = (size_t)&local_108;
          QVar17.field_0.m_data_utf8 = (char *)&local_88;
          QSettings::value(QVar17,(QVariant *)local_1c8[0].m_data);
          sVar6 = ::QVariant::toInt((bool *)&local_88);
          dirInfo.maxSize = sVar6;
          ::QVariant::~QVariant((QVariant *)&local_88);
          ::QVariant::~QVariant((QVariant *)local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
          local_178.d = (Data *)&iconDir;
          local_178.ptr = (char16_t *)0x6;
          local_178.size = 0x5c4a13;
          local_1a8.d = (Data *)0x0;
          local_1a8.ptr = (char16_t *)0x0;
          local_1a8.size = 0;
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    ((QAnyStringView *)local_1d8,
                     (QStringBuilder<QString_&,_QLatin1String> *)&local_178,
                     (wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> *)&local_1a8);
          ::QVariant::QVariant((QVariant *)local_a8,1);
          QVar18.m_size = (size_t)&local_108;
          QVar18.field_0.m_data_utf8 = (char *)&local_88;
          QSettings::value(QVar18,(QVariant *)local_1d8[0].m_data);
          sVar6 = ::QVariant::toInt((bool *)&local_88);
          dirInfo.scale = sVar6;
          ::QVariant::~QVariant((QVariant *)&local_88);
          ::QVariant::~QVariant((QVariant *)local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
          local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_178.d = (Data *)&iconDir;
          local_178.ptr = (char16_t *)&DAT_00000008;
          local_178.size = 0x5c4a1a;
          local_1a8.d = (Data *)0x0;
          local_1a8.ptr = (char16_t *)0x0;
          local_1a8.size = 0;
          QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                    (&local_1e8,(QStringBuilder<QString_&,_QLatin1String> *)&local_178,
                     (wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> *)&local_1a8);
          QVar19.m_size = (size_t)&local_108;
          QVar19.field_0.m_data_utf8 = (char *)&local_88;
          QSettings::value(QVar19);
          ::QVariant::toString();
          ::QVariant::~QVariant((QVariant *)&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
          local_88.a.d.d = (Data *)local_a8._0_8_;
          local_88.a.d.ptr = (char16_t *)local_a8._8_8_;
          local_88.a.d.size = local_a8._16_8_;
          if ((QArrayDataPointer<char16_t> *)local_a8._0_8_ != (QArrayDataPointer<char16_t> *)0x0) {
            LOCK();
            *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + 1;
            UNLOCK();
          }
          local_178.d = (Data *)&DAT_0000000c;
          local_178.ptr = L"Applications";
          bVar4 = ::operator==(&local_88.a,(QLatin1StringView *)&local_178);
          CVar5 = Applications;
          if (!bVar4) {
            local_178.d = (Data *)&DAT_00000009;
            local_178.ptr = L"MimeTypes";
            bVar4 = ::operator==(&local_88.a,(QLatin1StringView *)&local_178);
            CVar5 = bVar4 * '\x02';
          }
          dirInfo.context = CVar5;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
          QList<QIconDirInfo>::emplaceBack<QIconDirInfo_const&>(&this->m_keyList,&dirInfo);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dirInfo);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&iconDir);
        }
      }
      pQVar12 = pQVar12 + 1;
    }
    QVar20.m_size = (size_t)&local_108;
    QVar20.field_0.m_data = &dirInfo;
    QSettings::value(QVar20);
    ::QVariant::toStringList();
    QArrayDataPointer<QString>::operator=
              (&(this->m_parents).d,(QArrayDataPointer<QString> *)&local_88);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_88);
    ::QVariant::~QVariant((QVariant *)&dirInfo);
    dirInfo.path.d.d._0_4_ = 0;
    dirInfo.path.d.d._4_4_ = 0;
    dirInfo.path.d.ptr._0_4_ = 0;
    dirInfo.path.d.ptr._4_4_ = 0;
    dirInfo.path.d.size._0_4_ = 0;
    dirInfo.path.d.size._4_4_ = 0;
    QtPrivate::sequential_erase_with_copy<QList<QString>,QString>(&this->m_parents,&dirInfo.path);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dirInfo);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&themeDirInfo);
    QSettings::~QSettings((QSettings *)&local_108);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  QFile::~QFile((QFile *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QIconTheme::QIconTheme(const QString &themeName)
        : m_valid(false)
{
    QFile themeIndex;

    const QStringList iconDirs = QIcon::themeSearchPaths();
    for ( int i = 0 ; i < iconDirs.size() ; ++i) {
        QDir iconDir(iconDirs[i]);
        QString themeDir = iconDir.path() + u'/' + themeName;
        QFileInfo themeDirInfo(themeDir);

        if (themeDirInfo.isDir()) {
            m_contentDirs << themeDir;
            m_gtkCaches << QSharedPointer<QIconCacheGtkReader>::create(themeDir);
        }

        if (!m_valid) {
            themeIndex.setFileName(themeDir + "/index.theme"_L1);
            m_valid = themeIndex.exists();
            qCDebug(lcIconLoader) << "Probing theme file at" << themeIndex.fileName() << m_valid;
        }
    }
#if QT_CONFIG(settings)
    if (m_valid) {
        const QSettings indexReader(themeIndex.fileName(), QSettings::IniFormat);
        const QStringList keys = indexReader.allKeys();
        for (const QString &key : keys) {
            if (key.endsWith("/Size"_L1)) {
                // Note the QSettings ini-format does not accept
                // slashes in key names, hence we have to cheat
                if (int size = indexReader.value(key).toInt()) {
                    QString directoryKey = key.left(key.size() - 5);
                    QIconDirInfo dirInfo(directoryKey);
                    dirInfo.size = size;
                    QString type = indexReader.value(directoryKey + "/Type"_L1).toString();

                    if (type == "Fixed"_L1)
                        dirInfo.type = QIconDirInfo::Fixed;
                    else if (type == "Scalable"_L1)
                        dirInfo.type = QIconDirInfo::Scalable;
                    else
                        dirInfo.type = QIconDirInfo::Threshold;

                    dirInfo.threshold = indexReader.value(directoryKey +
                                                          "/Threshold"_L1,
                                                          2).toInt();

                    dirInfo.minSize = indexReader.value(directoryKey + "/MinSize"_L1, size).toInt();

                    dirInfo.maxSize = indexReader.value(directoryKey + "/MaxSize"_L1, size).toInt();

                    dirInfo.scale = indexReader.value(directoryKey + "/Scale"_L1, 1).toInt();

                    const QString context = indexReader.value(directoryKey + "/Context"_L1).toString();
                    dirInfo.context = [context]() {
                        if (context == "Applications"_L1)
                            return QIconDirInfo::Applications;
                        else if (context == "MimeTypes"_L1)
                            return QIconDirInfo::MimeTypes;
                        else
                            return QIconDirInfo::UnknownContext;
                    }();

                    m_keyList.append(dirInfo);
                }
            }
        }

        // Parent themes provide fallbacks for missing icons
        m_parents = indexReader.value("Icon Theme/Inherits"_L1).toStringList();
        m_parents.removeAll(QString());
    }
#endif // settings
}